

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

bool __thiscall
CNetBan::IsBanned(CNetBan *this,NETADDR_conflict *pAddr,char *pBuf,uint BufferSize,
                 int *pLastInfoQuery)

{
  bool bVar1;
  uint uVar2;
  CBanPool<NETADDR,_1> *pCVar3;
  CBan<NETADDR> *pBuf_00;
  CBan<CNetRange> *pLastInfoQuery_00;
  NETADDR_conflict *in_RSI;
  CNetBan *in_RDI;
  CNetBan *in_R8;
  long in_FS_OFFSET;
  CBanRange *pBan_1;
  int i;
  CBanAddr *pBan;
  int Length;
  CNetHash aHash [17];
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  CBanPool<NETADDR,_1> *local_f0;
  int *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint BuffSize;
  char *pBuf_01;
  undefined4 in_stack_ffffffffffffff30;
  bool local_99;
  undefined1 local_98 [144];
  CBan<NETADDR> *local_8;
  
  local_8 = *(CBan<NETADDR> **)(in_FS_OFFSET + 0x28);
  pCVar3 = (CBanPool<NETADDR,_1> *)local_98;
  do {
    local_f0 = pCVar3;
    CNetHash::CNetHash((CNetHash *)local_f0);
    pCVar3 = (CBanPool<NETADDR,_1> *)(local_f0->m_paaHashList[0] + 1);
  } while (pCVar3 != (CBanPool<NETADDR,_1> *)(local_98 + 0x88));
  uVar2 = CNetHash::MakeHashArray(in_RSI,(CNetHash *)local_98);
  pBuf_00 = CBanPool<NETADDR,_1>::Find
                      (local_f0,(CDataType *)
                                CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       (CNetHash *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (pBuf_00 == (CBan<NETADDR> *)0x0) {
    pBuf_01 = (char *)0x0;
    BuffSize = uVar2;
    while (BuffSize = BuffSize - 1, -1 < (int)BuffSize) {
      for (pLastInfoQuery_00 =
                CBanPool<CNetRange,_16>::First
                          (&in_RDI->m_BanRangePool,(CNetHash *)(local_98 + (long)(int)BuffSize * 8))
          ; pLastInfoQuery_00 != (CBan<CNetRange> *)0x0;
          pLastInfoQuery_00 = pLastInfoQuery_00->m_pHashNext) {
        bVar1 = NetMatch(in_RDI,(CNetRange *)local_f0,
                         (NETADDR_conflict *)
                         CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
        if (bVar1) {
          MakeBanInfo<CNetRange>
                    (in_R8,(CBan<CNetRange> *)CONCAT44(uVar2,in_stack_ffffffffffffff30),pBuf_01,
                     BuffSize,in_stack_ffffffffffffff20,(int *)pLastInfoQuery_00);
          local_99 = true;
          goto LAB_00241ac3;
        }
      }
    }
    local_99 = false;
  }
  else {
    MakeBanInfo<NETADDR>
              (in_R8,(CBan<NETADDR> *)CONCAT44(uVar2,in_stack_ffffffffffffff30),(char *)pBuf_00,
               in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_99 = true;
  }
LAB_00241ac3:
  if (*(CBan<NETADDR> **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_99;
}

Assistant:

bool CNetBan::IsBanned(const NETADDR *pAddr, char *pBuf, unsigned BufferSize, int *pLastInfoQuery)
{
	CNetHash aHash[17];
	int Length = CNetHash::MakeHashArray(pAddr, aHash);

	// check ban addresses
	CBanAddr *pBan = m_BanAddrPool.Find(pAddr, &aHash[Length]);
	if(pBan)
	{
		MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
		return true;
	}

	// check ban ranges
	for(int i = Length-1; i >= 0; --i)
	{
		for(CBanRange *pBan = m_BanRangePool.First(&aHash[i]); pBan; pBan = pBan->m_pHashNext)
		{
			if(NetMatch(&pBan->m_Data, pAddr, i, Length))
			{
				MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
				return true;
			}
		}
	}

	return false;
}